

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLIFilePartLoader.cpp
# Opt level: O0

UniqueId * __thiscall
COLLADASaxFWL::IFilePartLoader::createUniqueIdFromUrl
          (IFilePartLoader *this,ParserChar *url,ClassId classId)

{
  char *in_RSI;
  long *in_RDI;
  URI uri;
  allocator<char> *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  String *in_stack_fffffffffffffed0;
  URI *in_stack_fffffffffffffed8;
  URI *in_stack_fffffffffffffee0;
  ClassId in_stack_fffffffffffffeec;
  URI *in_stack_fffffffffffffef0;
  Loader *in_stack_fffffffffffffef8;
  URI *local_8;
  
  if ((in_RSI == (char *)0x0) || (*in_RSI == '\0')) {
    local_8 = (URI *)&COLLADAFW::UniqueId::INVALID;
  }
  else {
    (**(code **)(*in_RDI + 0x58))();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    COLLADABU::URI::URI(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                        in_stack_fffffffffffffed0);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffed8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffed7);
    (**(code **)(*in_RDI + 0x38))();
    local_8 = (URI *)Loader::getUniqueId(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                                         in_stack_fffffffffffffeec);
    COLLADABU::URI::~URI(local_8);
  }
  return (UniqueId *)local_8;
}

Assistant:

const COLLADAFW::UniqueId& IFilePartLoader::createUniqueIdFromUrl( const ParserChar* url, COLLADAFW::ClassId classId )
	{
		COLLADABU_ASSERT( getColladaLoader() );
		if ( !url || !(*url) )
			return COLLADAFW::UniqueId::INVALID;

		COLLADABU::URI uri(getFileUri(), String((const char *)url));

		return getColladaLoader()->getUniqueId(uri, classId);
	}